

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O1

void usrc_writeUTrie2Arrays
               (FILE *f,char *indexPrefix,char *data32Prefix,UTrie2 *pTrie,char *postfix)

{
  int32_t width;
  uint32_t *p;
  int32_t length;
  
  p = (uint32_t *)pTrie->index;
  if (pTrie->data32 == (uint32_t *)0x0) {
    length = pTrie->indexLength + pTrie->dataLength;
    width = 0x10;
    data32Prefix = indexPrefix;
  }
  else {
    usrc_writeArray(f,indexPrefix,p,0x10,pTrie->indexLength,postfix);
    p = pTrie->data32;
    length = pTrie->dataLength;
    width = 0x20;
  }
  usrc_writeArray(f,data32Prefix,p,width,length,postfix);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usrc_writeUTrie2Arrays(FILE *f,
                       const char *indexPrefix, const char *data32Prefix,
                       const UTrie2 *pTrie,
                       const char *postfix) {
    if(pTrie->data32==NULL) {
        /* 16-bit trie */
        usrc_writeArray(f, indexPrefix, pTrie->index, 16, pTrie->indexLength+pTrie->dataLength, postfix);
    } else {
        /* 32-bit trie */
        usrc_writeArray(f, indexPrefix, pTrie->index, 16, pTrie->indexLength, postfix);
        usrc_writeArray(f, data32Prefix, pTrie->data32, 32, pTrie->dataLength, postfix);
    }
}